

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  path *ppVar3;
  bool local_2a9;
  string local_278;
  string local_258;
  string local_238;
  string_type local_218;
  byte local_1f1;
  path local_1f0;
  path local_1c8;
  path local_1a0;
  undefined1 local_178 [8];
  path ext;
  directory_entry *entry;
  undefined1 local_138 [8];
  directory_iterator __end1;
  undefined1 local_118 [8];
  directory_iterator __begin1;
  directory_iterator local_e0;
  directory_iterator *local_d0;
  directory_iterator *__range1;
  string platp;
  double plate_scale;
  int image_size;
  string output_path;
  string local_70 [8];
  string backgr_path;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string plates_path;
  char **argv_local;
  int argc_local;
  
  plates_path.field_2._8_8_ = argv;
  if (argc < 6) {
    std::operator<<((ostream *)&std::cout,
                    "Usage: datset /path/to/plates/ /path/to/background/ ./output_path output_image_size scale_factor number_of_warps\n"
                   );
    argv_local._4_4_ = -1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator(&local_39);
    pcVar1 = *(char **)(plates_path.field_2._8_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_70,pcVar1,(allocator<char> *)(output_path.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(output_path.field_2._M_local_buf + 0xf));
    pcVar1 = *(char **)(plates_path.field_2._8_8_ + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&image_size,pcVar1,(allocator<char> *)((long)&plate_scale + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&plate_scale + 7));
    plate_scale._0_4_ = atoi(*(char **)(plates_path.field_2._8_8_ + 0x20));
    platp.field_2._8_8_ = atof(*(char **)(plates_path.field_2._8_8_ + 0x28));
    std::__cxx11::string::string((string *)&__range1);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&__begin1._M_dir._M_refcount,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               auto_format);
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              (&local_e0,(path *)&__begin1._M_dir._M_refcount);
    std::filesystem::__cxx11::path::~path((path *)&__begin1._M_dir._M_refcount);
    local_d0 = &local_e0;
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)&__end1._M_dir._M_refcount,local_d0);
    std::filesystem::__cxx11::begin
              ((__cxx11 *)local_118,(directory_iterator *)&__end1._M_dir._M_refcount);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)&__end1._M_dir._M_refcount);
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)&entry,local_d0);
    std::filesystem::__cxx11::end((directory_iterator *)local_138);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&entry);
    while (bVar2 = std::filesystem::__cxx11::operator!=
                             ((directory_iterator *)local_118,(directory_iterator *)local_138),
          bVar2) {
      ext._32_8_ = std::filesystem::__cxx11::directory_iterator::operator*
                             ((directory_iterator *)local_118);
      ppVar3 = std::filesystem::__cxx11::directory_entry::path((directory_entry *)ext._32_8_);
      std::filesystem::__cxx11::path::filename(&local_1a0,ppVar3);
      std::filesystem::__cxx11::path::extension((path *)local_178,&local_1a0);
      std::filesystem::__cxx11::path::~path(&local_1a0);
      local_1f1 = 0;
      std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                (&local_1c8,(char (*) [5])".jpg",auto_format);
      bVar2 = std::filesystem::__cxx11::operator==((path *)local_178,&local_1c8);
      local_2a9 = true;
      if (!bVar2) {
        std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                  (&local_1f0,(char (*) [5])".png",auto_format);
        local_1f1 = 1;
        local_2a9 = std::filesystem::__cxx11::operator==((path *)local_178,&local_1f0);
      }
      if ((local_1f1 & 1) != 0) {
        std::filesystem::__cxx11::path::~path(&local_1f0);
      }
      std::filesystem::__cxx11::path::~path(&local_1c8);
      if (local_2a9 != false) {
        ppVar3 = std::filesystem::__cxx11::directory_entry::path((directory_entry *)ext._32_8_);
        std::filesystem::__cxx11::path::operator_cast_to_string(&local_218,ppVar3);
        std::__cxx11::string::operator=((string *)&__range1,(string *)&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::string((string *)&local_238,(string *)&__range1);
        std::__cxx11::string::string((string *)&local_258,local_70);
        std::__cxx11::string::string((string *)&local_278,(string *)&image_size);
        generateDatasetImages
                  (&local_238,&local_258,&local_278,plate_scale._0_4_,(double)platp.field_2._8_8_,5)
        ;
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
      }
      std::filesystem::__cxx11::path::~path((path *)local_178);
      std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_118);
    }
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)local_138);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)local_118);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_e0);
    argv_local._4_4_ = 0;
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::string::~string((string *)&image_size);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const *argv[]) {
    if (argc<6) {
        cout<<"Usage: datset /path/to/plates/ /path/to/background/ ./output_path output_image_size scale_factor number_of_warps\n";
        return -1;
    }

    string plates_path = string(argv[1]);
    string backgr_path = string(argv[2]);
    string output_path = string(argv[3]);
    int image_size = atoi(argv[4]);
    double plate_scale = atof(argv[5]);

    string platp;
    for (const auto & entry : filesystem::directory_iterator(plates_path)) {
        auto ext = entry.path().filename().extension();
        if (ext == ".jpg" || ext ==".png") { 
            platp = entry.path();
            generateDatasetImages(platp, backgr_path, output_path,  image_size, plate_scale, 5);
        }
    } 
    return 0;
}